

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::initBound(HModel *this,int phase)

{
  double dVar1;
  double dVar2;
  reference pvVar3;
  int in_ESI;
  long in_RDI;
  HModel *unaff_retaddr;
  int i;
  double inf;
  undefined4 local_1c;
  long lVar4;
  
  lVar4 = in_RDI;
  initPh2ColBound(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  initPh2RowBound(unaff_retaddr,(int)((ulong)lVar4 >> 0x20),(int)lVar4);
  if (in_ESI != 2) {
    for (local_1c = 0; local_1c < *(int *)(in_RDI + 0x614); local_1c = local_1c + 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7e0),(long)local_1c
                         );
      if ((*pvVar3 != -1e+200) || (NAN(*pvVar3))) {
LAB_001756ce:
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7e0),
                            (long)local_1c);
        if ((*pvVar3 != -1e+200) || (NAN(*pvVar3))) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7f8),
                              (long)local_1c);
          if ((*pvVar3 != 1e+200) || (NAN(*pvVar3))) {
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7e0),
                                (long)local_1c);
            *pvVar3 = 0.0;
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7f8),
                                (long)local_1c);
            *pvVar3 = 0.0;
          }
          else {
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7e0),
                                (long)local_1c);
            *pvVar3 = 0.0;
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7f8),
                                (long)local_1c);
            *pvVar3 = 1.0;
          }
        }
        else {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7e0),
                              (long)local_1c);
          *pvVar3 = -1.0;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7f8),
                              (long)local_1c);
          *pvVar3 = 0.0;
        }
LAB_001757e5:
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7f8),
                            (long)local_1c);
        dVar1 = *pvVar3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7e0),
                            (long)local_1c);
        dVar2 = *pvVar3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x810),
                            (long)local_1c);
        *pvVar3 = dVar1 - dVar2;
      }
      else {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7f8),
                            (long)local_1c);
        if ((*pvVar3 != 1e+200) || (NAN(*pvVar3))) goto LAB_001756ce;
        if (local_1c < *(int *)(in_RDI + 0x60c)) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7e0),
                              (long)local_1c);
          *pvVar3 = -1000.0;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7f8),
                              (long)local_1c);
          *pvVar3 = 1000.0;
          goto LAB_001757e5;
        }
      }
    }
  }
  return;
}

Assistant:

void HModel::initBound(int phase) {
  // Initialise the Phase 2 bounds (and ranges). NB Phase 2 bounds
  // necessary to compute Phase 1 bounds
  initPh2ColBound(0, numCol-1);
  initPh2RowBound(0, numRow-1);
  if (phase == 2) return;

  // In Phase 1: change to dual phase 1 bound
  const double inf = HSOL_CONST_INF;
  for (int i = 0; i < numTot; i++) {
    if (workLower[i] == -inf && workUpper[i] == inf) {
      // Won't change for row variables: they should never become
      // non basic
      if (i >= numCol) continue;
      workLower[i] = -1000, workUpper[i] = 1000;  // FREE
    } else if (workLower[i] == -inf) {
      workLower[i] = -1, workUpper[i] = 0;        // UPPER
    } else if (workUpper[i] == inf) {
      workLower[i] = 0, workUpper[i] = 1;         // LOWER
    } else {
      workLower[i] = 0, workUpper[i] = 0;         // BOXED or FIXED
    }
    workRange[i] = workUpper[i] - workLower[i];
  }
}